

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load3.h
# Opt level: O2

uint64_t __thiscall
highwayhash::SSE41::Load3::operator()(undefined8 param_1,undefined1 *param_2,ulong param_3)

{
  if (param_3 != 0) {
    return (ulong)CONCAT12(param_2[param_3 - 1],CONCAT11(param_2[param_3 >> 1],*param_2));
  }
  return 0;
}

Assistant:

HH_INLINE uint64_t operator()(AllowUnordered, const char* from,
                                const size_t size_mod4) {
    uint64_t last3 = 0;
    // Not allowed to read any bytes; early-out is faster than reading from a
    // constant array of zeros.
    if (size_mod4 == 0) {
      return last3;
    }

    // These indices are chosen as an easy-to-compute sequence containing the
    // same elements as [0, size), but repeated and/or reordered. This enables
    // unconditional loads, which outperform conditional 8 or 16+8 bit loads.
    const uint64_t idx0 = 0;
    const uint64_t idx1 = size_mod4 >> 1;
    const uint64_t idx2 = size_mod4 - 1;
    // Store into least significant bytes (avoids one shift).
    last3 = U64FromChar(from[idx0]);
    last3 += U64FromChar(from[idx1]) << 8;
    last3 += U64FromChar(from[idx2]) << 16;
    return last3;
  }